

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

bool __thiscall Hpipe::Cond::never_checked(Cond *this,Cond *not_in)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  if (not_in == (Cond *)0x0) {
    do {
      bVar4 = uVar2 == 0x100;
      if (bVar4) {
        return bVar4;
      }
      uVar3 = uVar2 >> 6;
      uVar1 = uVar2 & 0x3f;
      uVar2 = uVar2 + 1;
    } while (((this->p).super__Base_bitset<4UL>._M_w[uVar3] >> uVar1 & 1) == 0);
  }
  else {
    for (; bVar4 = uVar2 == 0x100, !bVar4; uVar2 = uVar2 + 1) {
      if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) &&
         (((this->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) != 0)) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

bool Cond::never_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and p[ i ] )
                return false;
    } else {
        for( int i = 0; i < p_size; ++i )
            if ( p[ i ] )
                return false;
    }
    return true;
}